

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O2

void __thiscall
helics::CommsBroker<helics::zeromq::ZmqCommsSS,_helics::CommonCore>::commDisconnect
          (CommsBroker<helics::zeromq::ZmqCommsSS,_helics::CommonCore> *this)

{
  undefined1 *puVar1;
  bool bVar2;
  
  puVar1 = &(this->super_CommonCore).field_0xd84;
  LOCK();
  bVar2 = *(int *)puVar1 == 0;
  if (bVar2) {
    *(undefined4 *)puVar1 = 1;
  }
  UNLOCK();
  if (bVar2) {
    CommsInterface::disconnect
              ((CommsInterface *)
               (this->comms)._M_t.
               super___uniq_ptr_impl<helics::zeromq::ZmqCommsSS,_std::default_delete<helics::zeromq::ZmqCommsSS>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::zeromq::ZmqCommsSS_*,_std::default_delete<helics::zeromq::ZmqCommsSS>_>
               .super__Head_base<0UL,_helics::zeromq::ZmqCommsSS_*,_false>._M_head_impl);
    LOCK();
    *(undefined4 *)&(this->super_CommonCore).field_0xd84 = 2;
    UNLOCK();
  }
  return;
}

Assistant:

void CommsBroker<COMMS, BrokerT>::commDisconnect()
{
    int exp = 0;
    if (disconnectionStage.compare_exchange_strong(exp, 1)) {
        comms->disconnect();
        disconnectionStage = 2;
    }
}